

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_rtrim(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  char cVar1;
  undefined8 in_RAX;
  char *zString;
  ushort **ppuVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  int nLen;
  int nListlen;
  undefined8 local_38;
  
  if (nArg < 1) {
    jx9_result_null(pCtx);
    return 0;
  }
  local_38 = in_RAX;
  zString = jx9_value_to_string(*apArg,(int *)&local_38);
  if (0 < (long)(int)local_38) {
    lVar6 = (long)(int)local_38;
    if (nArg == 1) {
      while (lVar7 = lVar6, lVar7 != 0) {
        cVar1 = zString[lVar7 + -1];
        if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
           ((lVar6 = lVar7 + -1, cVar1 != '\0' &&
            (ppuVar2 = __ctype_b_loc(),
            (*(byte *)((long)*ppuVar2 + (long)cVar1 * 2 + 1) & 0x20) == 0)))) goto LAB_0012b4bc;
      }
      lVar7 = 0;
LAB_0012b4bc:
      local_38._0_4_ = (int)lVar7;
      goto LAB_0012b4c5;
    }
    pcVar3 = jx9_value_to_string(apArg[1],(int *)((long)&local_38 + 4));
    if ((long)local_38._4_4_ < 1) goto LAB_0012b4c5;
    pcVar5 = zString + (long)(int)local_38 + -1;
    do {
      pcVar4 = pcVar5;
      if (pcVar4 <= zString) goto LAB_0012b4ab;
      pcVar5 = pcVar4;
      for (lVar6 = 0; local_38._4_4_ != lVar6; lVar6 = lVar6 + 1) {
        if (zString < pcVar5) {
          pcVar5 = pcVar5 + -(ulong)(*pcVar5 == pcVar3[lVar6]);
        }
      }
    } while (pcVar5 != pcVar4);
    if (zString < pcVar4) {
      local_38._0_4_ = ((int)pcVar4 - (int)zString) + 1;
      goto LAB_0012b4c5;
    }
  }
LAB_0012b4ab:
  zString = "";
  local_38._0_4_ = 0;
LAB_0012b4c5:
  jx9_result_string(pCtx,zString,(int)local_38);
  return 0;
}

Assistant:

static int jx9Builtin_rtrim(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the target string */
	zString = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Empty string, return */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Start the trim process */
	if( nArg < 2 ){
		SyString sStr;
		/* Remove white spaces and NUL bytes*/
		SyStringInitFromBuf(&sStr, zString, nLen);
		SyStringRightTrimSafe(&sStr);
		jx9_result_string(pCtx, sStr.zString, (int)sStr.nByte);
	}else{
		/* Char list */
		const char *zList;
		int nListlen;
		zList = jx9_value_to_string(apArg[1], &nListlen);
		if( nListlen < 1 ){
			/* Return the string unchanged */
			jx9_result_string(pCtx, zString, nLen);
		}else{
			const char *zEnd = &zString[nLen - 1];
			const char *zCur = zString;
			const char *zPtr;
			int i;
			/* Right trim */
			for(;;){
				if( zEnd <= zCur ){
					break;
				}
				zPtr = zEnd;
				for( i = 0 ; i < nListlen ; i++ ){
					if( zEnd > zCur && zEnd[0] == zList[i] ){
						zEnd--;
					}
				}
				if( zEnd == zPtr ){
					break;
				}
			}
			if( zEnd <= zCur ){
				/* Return the empty string */
				jx9_result_string(pCtx, "", 0);
			}else{
				zEnd++;
				jx9_result_string(pCtx, zCur, (int)(zEnd-zCur));
			}
		}
	}
	return JX9_OK;
}